

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::OpenPopupEx(ImGuiID id)

{
  ImVector<ImGuiPopupData> *this;
  int i;
  int iVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  uint *puVar4;
  ImGuiPopupData *pIVar5;
  ImVec2 *mouse_pos;
  ImGuiPopupData local_60;
  
  pIVar2 = GImGui;
  i = (GImGui->BeginPopupStack).Size;
  local_60.OpenMousePos.x = 0.0;
  local_60.OpenMousePos.y = 0.0;
  local_60.Window = (ImGuiWindow *)0x0;
  local_60.SourceWindow = GImGui->NavWindow;
  iVar1 = GImGui->FrameCount;
  local_60.PopupId = id;
  local_60.OpenFrameCount = iVar1;
  puVar4 = ImVector<unsigned_int>::back(&GImGui->CurrentWindow->IDStack);
  local_60.OpenParentId = *puVar4;
  local_60.OpenPopupPos = NavCalcPreferredRefPos();
  mouse_pos = &(pIVar2->IO).MousePos;
  bVar3 = IsMousePosValid(mouse_pos);
  if (!bVar3) {
    mouse_pos = &local_60.OpenPopupPos;
  }
  local_60.OpenMousePos = *mouse_pos;
  this = &pIVar2->OpenPopupStack;
  if (i < (pIVar2->OpenPopupStack).Size) {
    pIVar5 = ImVector<ImGuiPopupData>::operator[](this,i);
    if ((pIVar5->PopupId == id) &&
       (pIVar5 = ImVector<ImGuiPopupData>::operator[](this,i),
       pIVar5->OpenFrameCount == pIVar2->FrameCount + -1)) {
      pIVar5 = ImVector<ImGuiPopupData>::operator[](this,i);
      pIVar5->OpenFrameCount = iVar1;
      return;
    }
    ImVector<ImGuiPopupData>::resize(this,i + 1);
    pIVar5 = ImVector<ImGuiPopupData>::operator[](this,i);
    *(ulong *)pIVar5 = CONCAT44(local_60._4_4_,local_60.PopupId);
    pIVar5->Window = local_60.Window;
    pIVar5->SourceWindow = local_60.SourceWindow;
    pIVar5->OpenFrameCount = local_60.OpenFrameCount;
    pIVar5->OpenParentId = local_60.OpenParentId;
    pIVar5->OpenPopupPos = local_60.OpenPopupPos;
    pIVar5->OpenMousePos = local_60.OpenMousePos;
  }
  else {
    ImVector<ImGuiPopupData>::push_back(this,&local_60);
  }
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    int current_stack_size = g.BeginPopupStack.Size;
    ImGuiPopupData popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.SourceWindow = g.NavWindow;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    //IMGUI_DEBUG_LOG("OpenPopupEx(0x%08X)\n", g.FrameCount, id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            g.OpenPopupStack.resize(current_stack_size + 1);
            g.OpenPopupStack[current_stack_size] = popup_ref;
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}